

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,MatrixView<const_double> *world_T_base,Span<const_double,__1L> s
          ,Span<const_double,__1L> base_velocity,Span<const_double,__1L> s_dot,
          Span<const_double,__1L> world_gravity)

{
  bool bVar1;
  char *pcVar2;
  Span<const_double,__1L> other;
  VectorDynSize local_220 [32];
  VectorDynSize local_200 [32];
  VectorFixSize<3U> local_1e0;
  SpatialVector<iDynTree::SpatialMotionVector> local_1c8;
  SpatialMotionVector local_198;
  Twist local_168 [48];
  MatrixView<const_double> local_138;
  Transform local_108 [96];
  MatrixFixSize local_a8 [128];
  
  if ((world_T_base->m_rows == 4) && (world_T_base->m_cols == 4)) {
    if (base_velocity.storage_.super_extent_type<_1L>.size_.size_ == 6) {
      local_138.m_storage = world_T_base->m_storage;
      local_138.m_rows = 4;
      local_138.m_cols = 4;
      local_138.m_storageOrder = world_T_base->m_storageOrder;
      local_138.m_innerStride = world_T_base->m_innerStride;
      local_138.m_outerStride = world_T_base->m_outerStride;
      MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)local_a8,&local_138);
      iDynTree::Transform::Transform(local_108,local_a8);
      iDynTree::VectorDynSize::VectorDynSize
                (local_200,s.storage_.super_extent_type<_1L>.size_.size_,s.storage_.data_);
      other.storage_.data_ = base_velocity.storage_.data_;
      other.storage_.super_extent_type<_1L>.size_ = 6;
      SpatialVector<iDynTree::SpatialMotionVector>::SpatialVector(&local_1c8,other);
      iDynTree::SpatialMotionVector::SpatialMotionVector(&local_198,(SpatialVector *)&local_1c8);
      iDynTree::Twist::Twist(local_168,&local_198);
      iDynTree::VectorDynSize::VectorDynSize
                (local_220,s_dot.storage_.super_extent_type<_1L>.size_,s_dot.storage_.data_);
      VectorFixSize<3U>::VectorFixSize
                (&local_1e0,world_gravity.storage_.data_,
                 world_gravity.storage_.super_extent_type<_1L>.size_);
      bVar1 = setRobotState(this,local_108,local_200,local_168,local_220,&local_1e0);
      iDynTree::VectorDynSize::~VectorDynSize(local_220);
      iDynTree::VectorDynSize::~VectorDynSize(local_200);
      return bVar1;
    }
    pcVar2 = "Wrong size in input base_velocity";
  }
  else {
    pcVar2 = "Wrong size in input world_T_base";
  }
  iDynTree::reportError("KinDynComputations","setRobotState",pcVar2);
  return false;
}

Assistant:

bool KinDynComputations::setRobotState(iDynTree::MatrixView<const double> world_T_base,
                                       Span<const double> s,
                                       Span<const double> base_velocity,
                                       Span<const double> s_dot,
                                       Span<const double> world_gravity)

{

    constexpr int expected_transform_cols = 4;
    constexpr int expected_transform_rows = 4;
    bool ok = (world_T_base.rows() == expected_transform_rows) && (world_T_base.cols() == expected_transform_cols);
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input world_T_base");
        return false;
    }

    constexpr int expected_twist_size = 6;
    ok = base_velocity.size() == expected_twist_size;
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input base_velocity");
        return false;
    }


    return this->setRobotState(iDynTree::Transform(world_T_base),
                               s,
                               iDynTree::SpatialMotionVector(base_velocity),
                               s_dot,
                               world_gravity);
}